

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar2;
  Options *pOVar3;
  undefined1 in_R8B;
  string_view local_208;
  undefined1 local_1f8 [80];
  string_view local_1a8;
  undefined1 local_198 [80];
  string_view local_148;
  undefined1 local_138 [80];
  string_view local_e8;
  undefined1 local_d8 [80];
  string_view local_88 [2];
  FieldDescriptor local_68;
  Printer *printer_local;
  RepeatedImmutableMessageFieldGenerator *this_local;
  
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  local_68.field_20 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27)printer;
  printer_local = (Printer *)this;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)&local_68,pOVar3);
  WriteFieldDocComment((java *)printer,pPVar1,&local_68,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)&local_68);
  aVar2 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,"$deprecation$java.util.List<$type$> \n    get$capitalized_name$List();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar2.default_value_enum_,
             &(this->super_ImmutableMessageFieldGenerator).variables_,local_88[0]);
  aVar2 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)local_d8,pOVar3);
  WriteFieldDocComment
            ((java *)aVar2.default_value_enum_,pPVar1,(FieldDescriptor *)local_d8,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options((Options *)local_d8);
  aVar2 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"$deprecation$$type$ get$capitalized_name$(int index);\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar2.default_value_enum_,
             &(this->super_ImmutableMessageFieldGenerator).variables_,local_e8);
  aVar2 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)local_138,pOVar3);
  WriteFieldDocComment
            ((java *)aVar2.default_value_enum_,pPVar1,(FieldDescriptor *)local_138,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options((Options *)local_138);
  aVar2 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"$deprecation$int get$capitalized_name$Count();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar2.default_value_enum_,
             &(this->super_ImmutableMessageFieldGenerator).variables_,local_148);
  aVar2 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)local_198,pOVar3);
  WriteFieldDocComment
            ((java *)aVar2.default_value_enum_,pPVar1,(FieldDescriptor *)local_198,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options((Options *)local_198);
  aVar2 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "$deprecation$java.util.List<? extends $type$OrBuilder> \n    get$capitalized_name$OrBuilderList();\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar2.default_value_enum_,
             &(this->super_ImmutableMessageFieldGenerator).variables_,local_1a8);
  aVar2 = local_68.field_20;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)local_1f8,pOVar3);
  WriteFieldDocComment
            ((java *)aVar2.default_value_enum_,pPVar1,(FieldDescriptor *)local_1f8,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options((Options *)local_1f8);
  aVar2 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_208,
             "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder(\n    int index);\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar2.default_value_enum_,
             &(this->super_ImmutableMessageFieldGenerator).variables_,local_208);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  // TODO: In the future, consider having methods specific to the
  // interface so that builders can choose dynamically to either return a
  // message or a nested builder, so that asking for the interface doesn't
  // cause a message to ever be built.
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<$type$> \n"
                 "    get$capitalized_name$List();\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<? extends $type$OrBuilder> \n"
                 "    get$capitalized_name$OrBuilderList();\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder(\n"
      "    int index);\n");
}